

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

size_t CMact_on_data(CMConnection conn,CMbuffer cm_buffer,char *buffer,size_t length)

{
  CMUnregCMHandler p_Var1;
  CMHandlerFunc p_Var2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  __pid_t _Var6;
  uint uVar7;
  pthread_t pVar8;
  ulong *puVar9;
  undefined8 uVar10;
  char *pcVar11;
  long lVar12;
  ulong in_RCX;
  uint *in_RDX;
  CMbuffer in_RSI;
  CMConnection_conflict in_RDI;
  char *in_stack_000000b8;
  int in_stack_000000c0;
  int in_stack_000000c4;
  size_t in_stack_000000c8;
  CMConnection in_stack_000000d0;
  timespec ts_9;
  timespec ts_8;
  CMbuffer local_res120;
  void *client_data;
  CMHandlerFunc handler;
  timespec ts_7;
  char *size_str;
  CMTransport in_stack_00000150;
  int r;
  timespec ts_6;
  timespec ts_5;
  timespec ts_4;
  timespec ts_3;
  timespec ts_2;
  char *incoming_name;
  FMFormat format;
  timespec ts_1;
  CMbuffer local_res1c8;
  int arg;
  uchar calculated_checksum;
  char *stone_base;
  int tmp_1;
  int tmp;
  timespec ts;
  size_t ret_1;
  CMbuffer local;
  int ret;
  int short_length;
  uchar checksum;
  int message_key;
  CMincoming_format_list cm_format;
  CManager_conflict cm;
  FFSTypeHandle original_format;
  FFSTypeHandle local_format;
  char *data_buffer;
  char *decode_buffer;
  int stone_id;
  int header_len;
  int i;
  int attr_length;
  int64_t decoded_length;
  int64_t data_length;
  attr_list attrs;
  CMbuffer cm_decode_buf;
  int handshake_version;
  int performance_func;
  int handshake;
  int evcontrol_msg;
  int event_msg;
  int performance_msg;
  int skip;
  int get_attrs;
  int byte_swap;
  char *check_sum_base;
  char *base;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  attr_list in_stack_fffffffffffffd30;
  FILE *pFVar13;
  attr_list in_stack_fffffffffffffd38;
  CManager_conflict in_stack_fffffffffffffd40;
  CMConnection in_stack_fffffffffffffd48;
  CManager in_stack_fffffffffffffd50;
  FILE *in_stack_fffffffffffffd58;
  CManager in_stack_fffffffffffffd60;
  CMConnection in_stack_fffffffffffffd68;
  CMTraceType CVar14;
  CManager in_stack_fffffffffffffd70;
  CMbuffer in_stack_fffffffffffffd78;
  CManager_conflict in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  CMConnection in_stack_fffffffffffffdc0;
  __time_t local_1d8;
  ssize_t in_stack_fffffffffffffe30;
  CManager_conflict in_stack_fffffffffffffe38;
  long local_1c0;
  CMbuffer local_1b8;
  timespec local_1a0;
  char *local_190;
  int local_184;
  timespec local_180;
  timespec local_170;
  timespec local_160;
  timespec local_150;
  timespec local_140;
  char *local_130;
  long local_128;
  timespec local_120;
  CMbuffer local_110;
  undefined4 local_108;
  byte local_101;
  ulong *local_100;
  undefined4 local_f8;
  undefined4 local_f4;
  timespec local_f0;
  size_t local_e0;
  long local_d8;
  int local_d0;
  int local_cc;
  byte local_c5;
  int local_c4;
  CMincoming_format_list local_c0;
  CManager local_b8;
  undefined8 local_b0;
  FFSTypeHandle local_a8;
  undefined1 *local_a0;
  void *local_98;
  undefined4 local_90;
  int local_8c;
  int local_88;
  undefined4 local_84;
  undefined8 local_80;
  ulong local_78;
  attr_list local_70;
  CMbuffer local_68;
  uint local_5c;
  uint local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  undefined4 *local_30;
  ulong local_28;
  uint *local_20;
  CMbuffer local_18;
  CMConnection_conflict local_10;
  
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  local_50 = 0;
  local_54 = 0;
  local_58 = 0;
  local_5c = 0;
  local_68 = (CMbuffer)0x0;
  local_70 = (attr_list)0x0;
  local_84 = 0;
  local_98 = (void *)0x0;
  local_b8 = in_RDI->cm;
  local_c0 = (CMincoming_format_list)0x0;
  local_cc = 1;
  if (in_RCX < 4) {
    return 4 - in_RCX;
  }
  uVar7 = (uint)*(ushort *)((long)in_RDX + 1);
  local_c4 = uVar7 << 8;
  local_20 = in_RDX;
  local_10 = in_RDI;
  if (local_c4 == 0x5645) {
    local_3c = 1;
LAB_00120954:
    local_50 = 1;
    goto LAB_00120c89;
  }
  if (uVar7 == 0x414d) {
    local_3c = 1;
LAB_00120939:
    local_40 = 1;
  }
  else {
    if (uVar7 == 0x424d) {
      local_3c = 1;
LAB_00120913:
      local_cc = 0;
      local_40 = 1;
      goto LAB_00120c89;
    }
    if (uVar7 == 0x444d) {
      local_3c = 1;
      goto LAB_00120c89;
    }
    if (uVar7 == 0x484d) {
      local_3c = 1;
LAB_001209bb:
      local_54 = 1;
      local_40 = 0;
      goto LAB_00120c89;
    }
    if (uVar7 == 0x4c4d) {
      local_3c = 1;
    }
    else {
      if (uVar7 == 0x4d41) goto LAB_00120939;
      if (uVar7 == 0x4d42) goto LAB_00120913;
      if (uVar7 == 0x4d44) goto LAB_00120c89;
      if (uVar7 == 0x4d48) goto LAB_001209bb;
      if (uVar7 != 0x4d4c) {
        if (uVar7 != 0x4d50) {
          if (uVar7 != 0x504d) {
            if (uVar7 != 0x455600) {
              local_d8 = 0;
              IntCManager_unlock(in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
                                 (int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
              CVar14 = (CMTraceType)((ulong)in_stack_fffffffffffffd68 >> 0x20);
              iVar5 = (int)((ulong)in_stack_fffffffffffffd40 >> 0x20);
              if ((*local_20 != 0x4f494250) && (*local_20 != 0x5042494f)) {
                local_d0 = CMdo_non_CM_handler(in_stack_fffffffffffffd48,iVar5,
                                               (char *)in_stack_fffffffffffffd38,
                                               (size_t)in_stack_fffffffffffffd30);
                IntCManager_lock(in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,iVar5);
                if (local_d8 != 0) {
                  cm_return_data_buf(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
                }
                if (local_d0 == -1) {
                  printf("Unknown message on connection %p, failed %d, closed %d, %x\n",local_10,
                         (ulong)(uint)local_10->failed,(ulong)(uint)local_10->closed,
                         (ulong)*local_20);
                  iVar5 = CMtrace_val[7];
                  if (local_10->cm->CMTrace_file == (FILE *)0x0) {
                    iVar5 = CMtrace_init(in_stack_fffffffffffffd70,CVar14);
                  }
                  if (iVar5 != 0) {
                    if (CMtrace_PID != 0) {
                      pFVar13 = (FILE *)local_10->cm->CMTrace_file;
                      _Var6 = getpid();
                      pVar8 = pthread_self();
                      fprintf(pFVar13,"P%lxT%lx - ",(long)_Var6,pVar8);
                    }
                    if (CMtrace_timing != 0) {
                      clock_gettime(1,&local_f0);
                      fprintf((FILE *)local_10->cm->CMTrace_file,"%lld.%.9ld - ",local_f0.tv_sec,
                              local_f0.tv_nsec);
                    }
                    fprintf((FILE *)local_10->cm->CMTrace_file,
                            "Calling connection unknown message failed with dereference %p\n",
                            local_10);
                  }
                  fflush((FILE *)local_10->cm->CMTrace_file);
                  INT_CMConnection_failed((CMConnection)in_stack_fffffffffffffd80);
                }
                return 0;
              }
              iVar4 = CM_pbio_query((CMConnection)ts_6.tv_sec,in_stack_00000150,size_str,
                                    ts_7.tv_nsec);
              local_e0 = (size_t)iVar4;
              IntCManager_lock(in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,iVar5);
              return local_e0;
            }
            goto LAB_00120954;
          }
          local_3c = 1;
        }
        local_48 = 1;
        local_cc = 0;
        goto LAB_00120c89;
      }
    }
    local_4c = 1;
    local_40 = 1;
  }
LAB_00120c89:
  if (local_40 == 1) {
    if (local_4c == 0) {
      local_44 = 4;
    }
    if (local_cc == 0) {
      local_44 = 0;
    }
    local_8c = 0x10;
  }
  else if (local_cc == 0) {
    local_8c = 0xc;
  }
  else {
    local_8c = 8;
  }
  if (in_RCX < (ulong)(long)local_8c) {
    return (long)local_8c - in_RCX;
  }
  puVar9 = (ulong *)((long)in_RDX + (long)local_44 + 4);
  if (local_cc == 0) {
    if (local_3c == 0) {
      local_c5 = (byte)*in_RDX;
      local_78 = *puVar9;
      if (local_8c != 0xc) {
        local_84 = (uint)puVar9[1];
      }
    }
    else {
      local_c5 = *(byte *)((long)in_RDX + 3);
      local_f8._0_2_ = CONCAT11(*(undefined1 *)((long)puVar9 + 2),*(undefined1 *)((long)puVar9 + 3))
      ;
      local_f8._0_3_ = CONCAT12(*(undefined1 *)((long)puVar9 + 1),(undefined2)local_f8);
      local_f8 = CONCAT13((char)*puVar9,(undefined3)local_f8);
      lVar12 = (long)local_f8;
      local_f8._0_2_ = CONCAT11(*(undefined1 *)((long)puVar9 + 6),*(undefined1 *)((long)puVar9 + 7))
      ;
      local_f8._0_3_ = CONCAT12(*(undefined1 *)((long)puVar9 + 5),(undefined2)local_f8);
      local_f8 = CONCAT13(*(undefined1 *)((long)puVar9 + 4),(undefined3)local_f8);
      local_78 = (long)local_f8 + (lVar12 << 0x20);
      if (local_8c != 0xc) {
        local_84._0_2_ =
             CONCAT11(*(undefined1 *)((long)puVar9 + 10),*(undefined1 *)((long)puVar9 + 0xb));
        local_84._0_3_ = CONCAT12(*(undefined1 *)((long)puVar9 + 9),(undefined2)local_84);
        local_84 = CONCAT13((char)puVar9[1],(undefined3)local_84);
      }
    }
  }
  else {
    if (local_3c == 0) {
      local_c5 = (byte)*in_RDX;
      iVar5 = (int)*puVar9;
      if (local_8c != 8) {
        local_84 = *(uint *)((long)puVar9 + 4);
      }
    }
    else {
      local_c5 = *(byte *)((long)in_RDX + 3);
      local_f4 = CONCAT13((char)*puVar9,
                          CONCAT12(*(undefined1 *)((long)puVar9 + 1),
                                   CONCAT11(*(undefined1 *)((long)puVar9 + 2),
                                            *(undefined1 *)((long)puVar9 + 3))));
      iVar5 = local_f4;
      if (local_8c != 8) {
        local_84._0_2_ =
             CONCAT11(*(undefined1 *)((long)puVar9 + 6),*(undefined1 *)((long)puVar9 + 7));
        local_84._0_3_ = CONCAT12(*(undefined1 *)((long)puVar9 + 5),(undefined2)local_84);
        local_84 = CONCAT13(*(undefined1 *)((long)puVar9 + 4),(undefined3)local_84);
      }
    }
    local_78 = (ulong)iVar5;
  }
  if ((local_48 != 0) || (local_50 != 0)) {
    local_58 = (uint)(byte)(local_78 >> 0x38);
    local_78 = (local_78 & 0xffffffffffffff) - 0xc;
  }
  if (local_54 != 0) {
    local_5c = (uint)(local_78 >> 0x18) & 0xff;
    local_78 = (local_78 & 0xffffff) - 8;
  }
  if (local_4c != 0) {
    local_100 = puVar9;
    if (local_8c == 0x10) {
      if (local_3c == 0) {
        local_90 = (uint)puVar9[1];
      }
      else {
        local_90._0_2_ =
             CONCAT11(*(undefined1 *)((long)puVar9 + 10),*(undefined1 *)((long)puVar9 + 0xb));
        local_90._0_3_ = CONCAT12(*(undefined1 *)((long)puVar9 + 9),(undefined2)local_90);
        local_90 = CONCAT13((char)puVar9[1],(undefined3)local_90);
      }
    }
    else if (local_8c == 0x14) {
      if (local_3c == 0) {
        local_90 = *(uint *)((long)puVar9 + 0xc);
      }
      else {
        local_90._0_2_ =
             CONCAT11(*(undefined1 *)((long)puVar9 + 0xe),*(undefined1 *)((long)puVar9 + 0xf));
        local_90._0_3_ = CONCAT12(*(undefined1 *)((long)puVar9 + 0xd),(undefined2)local_90);
        local_90 = CONCAT13(*(undefined1 *)((long)puVar9 + 0xc),(undefined3)local_90);
      }
    }
  }
  if ((long)in_RCX < (long)((long)local_8c + local_78 + (long)(int)local_84)) {
    return ((long)local_8c + local_78 + (long)(int)local_84) - in_RCX;
  }
  local_30 = (undefined4 *)((long)in_RDX + (long)local_8c);
  if (local_54 != 0) {
    CMdo_handshake(in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                   (int)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    return 0;
  }
  if (local_c5 != 0) {
    local_101 = 0;
    for (local_88 = 4; (ulong)(long)local_88 < in_RCX; local_88 = local_88 + 1) {
      local_101 = local_101 + *(char *)((long)in_RDX + (long)local_88);
    }
    if (local_101 != local_c5) {
      local_28 = in_RCX;
      printf("Discarding incoming message because of corruption.  Checksum mismatch got %x, expected %x\n"
             ,(ulong)local_101,(ulong)local_c5);
      printf("Message was : ");
      for (local_88 = 0; (ulong)(long)local_88 < local_28; local_88 = local_88 + 1) {
        printf(" %02x",(ulong)*(byte *)((long)local_20 + (long)local_88));
      }
      printf("\n");
      return 0;
    }
  }
  if (local_48 != 0) {
    CMdo_performance_response
              (in_stack_000000d0,in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,
               in_stack_000000b8);
    return 0;
  }
  if (local_50 != 0) {
    if (local_3c == 0) {
      local_108 = *local_30;
    }
    else {
      local_108 = CONCAT13(*(undefined1 *)local_30,
                           CONCAT12(*(undefined1 *)((long)local_30 + 1),
                                    CONCAT11(*(undefined1 *)((long)local_30 + 2),
                                             *(undefined1 *)((long)local_30 + 3))));
    }
    INT_EVhandle_control_message
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               (uchar)((ulong)in_stack_fffffffffffffd40 >> 0x38),(int)in_stack_fffffffffffffd40);
    return 0;
  }
  local_a0 = (undefined1 *)((long)local_30 + (long)(int)local_84);
  local_18 = in_RSI;
  if (local_84 != 0) {
    local_70 = CMint_decode_attr_from_xmit
                         (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                          (char *)in_stack_fffffffffffffd50,
                          (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    iVar5 = CMtrace_val[4];
    if (local_10->cm->CMTrace_file == (FILE *)0x0) {
      iVar5 = CMtrace_init(in_stack_fffffffffffffd70,
                           (CMTraceType)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    }
    if (iVar5 != 0) {
      fprintf((FILE *)local_b8->CMTrace_file,"CM - Incoming read attributes -> ");
      fdump_attr_list(local_b8->CMTrace_file,local_70);
    }
  }
  if (local_4c != 0) {
    local_110 = (CMbuffer)0x0;
    iVar5 = CMtrace_val[4];
    if (local_b8->CMTrace_file == (FILE *)0x0) {
      iVar5 = CMtrace_init(in_stack_fffffffffffffd70,
                           (CMTraceType)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    }
    iVar4 = (int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
    if (iVar5 != 0) {
      if (CMtrace_PID != 0) {
        pFVar13 = (FILE *)local_b8->CMTrace_file;
        _Var6 = getpid();
        pVar8 = pthread_self();
        fprintf(pFVar13,"P%lxT%lx - ",(long)_Var6,pVar8);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_120);
        fprintf((FILE *)local_b8->CMTrace_file,"%lld.%.9ld - ",local_120.tv_sec,local_120.tv_nsec);
      }
      fprintf((FILE *)local_b8->CMTrace_file,
              "CM - Receiving event message data len %ld, attr len %d, stone_id %x\n",local_78,
              (ulong)local_84,(ulong)local_90);
    }
    fflush((FILE *)local_b8->CMTrace_file);
    if (local_70 == (attr_list)0x0) {
      local_70 = CMint_create_attr_list
                           (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58,iVar4);
    }
    set_int_attr(local_70,CM_EVENT_SIZE,local_78 & 0xffffffff);
    set_long_attr(local_70,CM_INCOMING_CONNECTION,local_10);
    if (local_18 == (CMbuffer)0x0) {
      local_110 = fill_cmbuffer(in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
                                (size_t)in_stack_fffffffffffffd30);
      local_a0 = local_a0 + ((long)local_110->buffer - (long)local_20);
      local_20 = (uint *)local_110->buffer;
      local_18 = local_110;
    }
    internal_cm_network_submit
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
               (attr_list)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               in_stack_fffffffffffffd60,(size_t)in_stack_fffffffffffffd58,in_stack_fffffffffffffd90
              );
    if (local_110 != (CMbuffer)0x0) {
      cm_return_data_buf(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    }
    free_attr_list(local_70);
    return 0;
  }
  uVar10 = FMContext_from_FFS(local_b8->FFScontext);
  local_128 = FMformat_from_ID(uVar10,local_a0);
  if (local_128 == 0) {
    printf("BAD INCOMING DATA\n");
    return 0;
  }
  local_130 = (char *)name_of_FMformat(local_128);
  for (local_88 = 0; local_88 < local_b8->reg_format_count; local_88 = local_88 + 1) {
    if ((local_b8->reg_formats[local_88]->registration_pending != 0) &&
       (iVar5 = strcmp(local_130,local_b8->reg_formats[local_88]->format_name), iVar5 == 0)) {
      CMcomplete_format_registration
                ((CMFormat)in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20)
                );
    }
  }
  local_a8 = (FFSTypeHandle)FFS_target_from_encode(local_10->cm->FFScontext,local_a0);
  local_b0 = FFSTypeHandle_from_encode(local_10->cm->FFScontext,local_a0);
  if (local_a8 != (FFSTypeHandle)0x0) {
    iVar5 = CMtrace_val[4];
    if (local_b8->CMTrace_file == (FILE *)0x0) {
      iVar5 = CMtrace_init(in_stack_fffffffffffffd70,
                           (CMTraceType)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    }
    if (iVar5 != 0) {
      if (CMtrace_PID != 0) {
        pFVar13 = (FILE *)local_b8->CMTrace_file;
        _Var6 = getpid();
        pVar8 = pthread_self();
        fprintf(pFVar13,"P%lxT%lx - ",(long)_Var6,pVar8);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_140);
        fprintf((FILE *)local_b8->CMTrace_file,"%lld.%.9ld - ",local_140.tv_sec,local_140.tv_nsec);
      }
      pFVar13 = (FILE *)local_b8->CMTrace_file;
      uVar10 = FMFormat_of_original(local_b0);
      uVar10 = name_of_FMformat(uVar10);
      fprintf(pFVar13,"CM - Receiving record of type %s, FFSformat %p\n",uVar10,local_b0);
    }
    fflush((FILE *)local_b8->CMTrace_file);
    for (local_88 = 0; CVar14 = (CMTraceType)((ulong)in_stack_fffffffffffffd68 >> 0x20),
        local_88 < local_b8->in_format_count; local_88 = local_88 + 1) {
      if (local_b8->in_formats[local_88].format == local_a8) {
        local_c0 = local_b8->in_formats + local_88;
        iVar5 = CMtrace_val[4];
        if (local_b8->CMTrace_file == (FILE *)0x0) {
          iVar5 = CMtrace_init(in_stack_fffffffffffffd70,CVar14);
        }
        if (iVar5 != 0) {
          if (CMtrace_PID != 0) {
            pFVar13 = (FILE *)local_b8->CMTrace_file;
            _Var6 = getpid();
            pVar8 = pthread_self();
            fprintf(pFVar13,"P%lxT%lx - ",(long)_Var6,pVar8);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_150);
            fprintf((FILE *)local_b8->CMTrace_file,"%lld.%.9ld - ",local_150.tv_sec,
                    local_150.tv_nsec);
          }
          fprintf((FILE *)local_b8->CMTrace_file,
                  "CM - Found incoming cm_format %p, matching FFSformat %p\n",local_c0,local_a8);
        }
        fflush((FILE *)local_b8->CMTrace_file);
      }
    }
    if (local_c0 == (CMincoming_format_list)0x0) {
      local_c0 = CMidentify_rollbackCMformat
                           (in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38);
      iVar5 = CMtrace_val[4];
      if (local_b8->CMTrace_file == (FILE *)0x0) {
        iVar5 = CMtrace_init(in_stack_fffffffffffffd70,CVar14);
      }
      if (iVar5 != 0) {
        if (CMtrace_PID != 0) {
          pFVar13 = (FILE *)local_b8->CMTrace_file;
          _Var6 = getpid();
          in_stack_fffffffffffffdc0 = (CMConnection)(long)_Var6;
          pVar8 = pthread_self();
          fprintf(pFVar13,"P%lxT%lx - ",in_stack_fffffffffffffdc0,pVar8);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_160);
          fprintf((FILE *)local_b8->CMTrace_file,"%lld.%.9ld - ",local_160.tv_sec,local_160.tv_nsec)
          ;
        }
        fprintf((FILE *)local_b8->CMTrace_file,"CM - Created cm_format %p, matching FFSformat %p\n",
                local_c0,local_b0);
      }
      fflush((FILE *)local_b8->CMTrace_file);
      if (local_c0 != (CMincoming_format_list)0x0) {
        iVar5 = CMtrace_val[4];
        if (local_b8->CMTrace_file == (FILE *)0x0) {
          iVar5 = CMtrace_init(in_stack_fffffffffffffd70,CVar14);
        }
        if (iVar5 != 0) {
          if (CMtrace_PID != 0) {
            pFVar13 = (FILE *)local_b8->CMTrace_file;
            _Var6 = getpid();
            lVar12 = (long)_Var6;
            pVar8 = pthread_self();
            fprintf(pFVar13,"P%lxT%lx - ",lVar12,pVar8);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_170);
            fprintf((FILE *)local_b8->CMTrace_file,"%lld.%.9ld - ",local_170.tv_sec,
                    local_170.tv_nsec);
          }
          pFVar13 = (FILE *)local_b8->CMTrace_file;
          uVar10 = FMFormat_of_original(local_b0);
          uVar10 = name_of_FMformat(uVar10);
          fprintf(pFVar13,"CM - Calling CMcreate_conversion type %s, format %p\n",uVar10,local_b0);
        }
        fflush((FILE *)local_b8->CMTrace_file);
        CMcreate_conversion(in_stack_fffffffffffffd50,
                            (CMincoming_format_list)in_stack_fffffffffffffd48);
        iVar5 = CMtrace_val[4];
        if (local_b8->CMTrace_file == (FILE *)0x0) {
          iVar5 = CMtrace_init(in_stack_fffffffffffffd70,CVar14);
        }
        if (iVar5 != 0) {
          if (CMtrace_PID != 0) {
            pFVar13 = (FILE *)local_b8->CMTrace_file;
            _Var6 = getpid();
            pVar8 = pthread_self();
            fprintf(pFVar13,"P%lxT%lx - ",(long)_Var6,pVar8);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_180);
            fprintf((FILE *)local_b8->CMTrace_file,"%lld.%.9ld - ",local_180.tv_sec,
                    local_180.tv_nsec);
          }
          uVar10 = local_b0;
          in_stack_fffffffffffffd80 = (CManager_conflict)local_b8->CMTrace_file;
          uVar7 = FFShas_conversion(local_b0);
          fprintf((FILE *)in_stack_fffffffffffffd80,
                  "CM - after CMcreate_conversion format %p, has_conversion is %d\n",uVar10,
                  (ulong)uVar7);
        }
        fflush((FILE *)local_b8->CMTrace_file);
      }
    }
    if ((local_c0 != (CMincoming_format_list)0x0) && (local_c0->handler != (CMHandlerFunc)0x0)) {
      iVar5 = FFShas_conversion(local_b0);
      if (iVar5 == 0) {
        CMcreate_conversion(in_stack_fffffffffffffd50,
                            (CMincoming_format_list)in_stack_fffffffffffffd48);
      }
      iVar5 = FFShas_conversion(local_b0);
      if (iVar5 != 0) {
        iVar5 = FFSdecode_in_place_possible(local_b0);
        if (iVar5 == 0) {
          local_80 = FFS_est_decode_length(local_b8->FFScontext,local_a0,local_78);
          local_68 = cm_get_data_buf(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
          local_98 = local_68->buffer;
          FFSdecode_to_buffer(local_b8->FFScontext,local_a0,local_98);
        }
        else {
          iVar5 = FFSdecode_in_place(local_b8->FFScontext,local_a0,&local_98);
          if (iVar5 == 0) {
            printf("Decode failed\n");
            return 0;
          }
        }
        iVar5 = CMtrace_val[4];
        if (local_10->cm->CMTrace_file == (FILE *)0x0) {
          iVar5 = CMtrace_init(in_stack_fffffffffffffd70,CVar14);
        }
        if (iVar5 != 0) {
          if (CMact_on_data::size_set == 0) {
            local_190 = getenv("CMDumpSize");
            CMact_on_data::size_set = CMact_on_data::size_set + 1;
            if (local_190 != (char *)0x0) {
              CMact_on_data::dump_char_limit = atoi(local_190);
            }
          }
          pFVar13 = (FILE *)local_b8->CMTrace_file;
          uVar10 = FMFormat_of_original(local_c0->format);
          uVar10 = name_of_FMformat(uVar10);
          fprintf(pFVar13,"CM - record type %s, contents are:\n  ",uVar10);
          CVar14 = (CMTraceType)((ulong)pFVar13 >> 0x20);
          in_stack_fffffffffffffd70 = (CManager)local_b8->CMTrace_file;
          uVar10 = FMFormat_of_original(local_c0->format);
          local_184 = FMfdump_data(in_stack_fffffffffffffd70,uVar10,local_98,
                                   CMact_on_data::dump_char_limit);
          if ((local_184 == 0) && (CMact_on_data::warned == 0)) {
            printf("\n\n  ****  Warning **** CM record dump truncated\n");
            printf("  To change size limits, set CMDumpSize environment variable.\n");
            CMact_on_data::warned = CMact_on_data::warned + 1;
          }
          fprintf((FILE *)local_b8->CMTrace_file,"\n=======\n");
        }
        if (local_70 == (attr_list)0x0) {
          local_70 = CMint_create_attr_list
                               (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58,
                                (int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
          CMint_attr_merge_lists
                    (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                     (char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),0);
        }
        else {
          CMint_attr_merge_lists
                    (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                     (char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),0);
        }
        iVar5 = CMtrace_val[7];
        if (local_b8->CMTrace_file == (FILE *)0x0) {
          iVar5 = CMtrace_init(in_stack_fffffffffffffd70,CVar14);
        }
        if (iVar5 != 0) {
          if (CMtrace_PID != 0) {
            in_stack_fffffffffffffd58 = (FILE *)local_b8->CMTrace_file;
            _Var6 = getpid();
            in_stack_fffffffffffffd60 = (CManager)(long)_Var6;
            pVar8 = pthread_self();
            fprintf(in_stack_fffffffffffffd58,"P%lxT%lx - ",in_stack_fffffffffffffd60,pVar8);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_1a0);
            fprintf((FILE *)local_b8->CMTrace_file,"%lld.%.9ld - ",local_1a0.tv_sec,
                    local_1a0.tv_nsec);
          }
          fprintf((FILE *)local_b8->CMTrace_file,"CM - add reference connection %p - handler\n",
                  local_10);
        }
        fflush((FILE *)local_b8->CMTrace_file);
        INT_CMConnection_add_reference((CMConnection)in_stack_fffffffffffffd40);
        p_Var2 = local_c0->handler;
        pvVar3 = local_c0->client_data;
        local_1b8 = (CMbuffer)0x0;
        if ((local_18 == (CMbuffer)0x0) && (local_98 == (void *)0x0)) {
          local_1b8 = fill_cmbuffer(in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
                                    (size_t)in_stack_fffffffffffffd30);
          local_20 = (uint *)local_1b8->buffer;
        }
        iVar5 = (int)((ulong)in_stack_fffffffffffffd40 >> 0x20);
        IntCManager_unlock(in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,iVar5);
        (*p_Var2)(local_b8,local_10,local_98,pvVar3,local_70);
        IntCManager_lock(in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,iVar5);
        iVar5 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
        if (local_1b8 != (CMbuffer)0x0) {
          cm_return_data_buf(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        }
        iVar4 = CMtrace_val[7];
        if (local_b8->CMTrace_file == (FILE *)0x0) {
          iVar4 = CMtrace_init(in_stack_fffffffffffffd70,CVar14);
        }
        if (iVar4 != 0) {
          if (CMtrace_PID != 0) {
            pFVar13 = (FILE *)local_b8->CMTrace_file;
            _Var6 = getpid();
            in_stack_fffffffffffffd50 = (CManager)(long)_Var6;
            pVar8 = pthread_self();
            fprintf(pFVar13,"P%lxT%lx - ",in_stack_fffffffffffffd50,pVar8);
            iVar5 = (int)((ulong)pFVar13 >> 0x20);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&stack0xfffffffffffffe38);
            fprintf((FILE *)local_b8->CMTrace_file,"%lld.%.9ld - ",in_stack_fffffffffffffe38,
                    local_1c0);
          }
          fprintf((FILE *)local_b8->CMTrace_file,"CM - delete reference connection %p - handler\n",
                  local_10);
        }
        fflush((FILE *)local_b8->CMTrace_file);
        INT_CMConnection_dereference(in_stack_fffffffffffffdc0);
        if (local_68 != (CMbuffer)0x0) {
          cm_return_data_buf(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
          local_68 = (CMbuffer)0x0;
        }
        if (local_70 != (attr_list)0x0) {
          CMint_free_attr_list
                    (in_stack_fffffffffffffd60,(attr_list)in_stack_fffffffffffffd58,
                     (char *)in_stack_fffffffffffffd50,iVar5);
          local_70 = (attr_list)0x0;
        }
        iVar5 = CMtrace_val[4];
        if (local_b8->CMTrace_file == (FILE *)0x0) {
          iVar5 = CMtrace_init(in_stack_fffffffffffffd70,CVar14);
        }
        if (iVar5 != 0) {
          if (CMtrace_PID != 0) {
            pFVar13 = (FILE *)local_b8->CMTrace_file;
            _Var6 = getpid();
            lVar12 = (long)_Var6;
            pVar8 = pthread_self();
            fprintf(pFVar13,"P%lxT%lx - ",lVar12,pVar8);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&local_1d8);
            fprintf((FILE *)local_b8->CMTrace_file,"%lld.%.9ld - ",local_1d8,
                    in_stack_fffffffffffffe30);
          }
          pFVar13 = (FILE *)local_b8->CMTrace_file;
          uVar10 = FMFormat_of_original(local_b0);
          uVar10 = name_of_FMformat(uVar10);
          fprintf(pFVar13,"CM - Finish processing - record of type %s\n",uVar10);
        }
        fflush((FILE *)local_b8->CMTrace_file);
        return 0;
      }
      __assert_fail("FFShas_conversion(original_format)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                    ,0xa51,"size_t CMact_on_data(CMConnection, CMbuffer, char *, size_t)");
    }
    pFVar13 = _stderr;
    uVar10 = FMFormat_of_original(local_b0);
    uVar10 = name_of_FMformat(uVar10);
    fprintf(pFVar13,"CM - No handler for incoming data of this version of format \"%s\"\n",uVar10);
    return 0;
  }
  if (local_10->cm->unregistered_format_handler == (CMUnregCMHandler)0x0) {
    fprintf(_stderr,"No conversion found for incoming CM message\n");
  }
  else {
    p_Var1 = local_10->cm->unregistered_format_handler;
    uVar10 = FMFormat_of_original(local_b0);
    pcVar11 = (char *)name_of_FMformat(uVar10);
    (*p_Var1)(local_10,pcVar11);
  }
  return 0;
}

Assistant:

static size_t
 CMact_on_data(CMConnection conn, CMbuffer cm_buffer, char *buffer, size_t length)
 {
     char *base = buffer;
     char *check_sum_base = buffer;
     int byte_swap = 0;
     int get_attrs = 0;
     int skip = 0;
     int performance_msg = 0, event_msg = 0, evcontrol_msg = 0, handshake = 0;
     int performance_func = 0, handshake_version = 0;
     CMbuffer cm_decode_buf = NULL;
     attr_list attrs = NULL;
     int64_t data_length, decoded_length;
     int attr_length = 0, i;
     int header_len;
     int stone_id;
     char *decode_buffer = NULL, *data_buffer;
     FFSTypeHandle local_format, original_format;
     CManager cm = conn->cm;
     CMincoming_format_list cm_format = NULL;
     int message_key;
     unsigned char checksum;
     int short_length = 1;

     if (length < 4) {
	 return 4 - length;
     }
     message_key = 0x00ffff00 & *((int*)buffer);
     switch (message_key) {  /* assume 4-byte int */
     case 0x00444d00: /* \0DMC reversed byte order */
	 byte_swap = 1;
     case 0x004d4400:  /* CMD\0 */
	 break;
     case 0x00424d00: /* \0BMC reversed byte order long msg*/
	 byte_swap = 1;
     case 0x004d4200:  /* CMB\0 long msg*/
	 short_length = 0;
	 get_attrs = 1;
	 break;
     case 0x00414d00: /* \0AMC reversed byte order */
	 byte_swap = 1;
     case 0x004d4100:  /* CMA\0 */
	 get_attrs = 1;
	 break;
     case 0x00005645: /* \0CVE reversed byte order */
	 byte_swap = 1;
     case 0x45560000: /* EVC\0 */
	 evcontrol_msg = 1;
	 break;
     case 0x00504d00: /* \0PMC reversed byte order */
	 byte_swap = 1;
     case 0x004d5000:  /* CMP\0 */
	 performance_msg = 1;
	 short_length = 0;
	 break;
     case 0x004c4d00: /* \0LMC reversed byte order */
	 byte_swap = 1;
     case 0x004d4c00:  /* CML\0 */
	 event_msg = 1;
	 get_attrs = 1;
	 break;
     case 0x00484d00: /* \0HMC reversed byte order - handshake */
	 byte_swap = 1;
     case 0x004d4800:  /* CMH\0 - handshake */
	 handshake = 1;
	 get_attrs = 0;
	 break;
     default:
	 /*  non CM message */
	 /*  lookup registered message prefixes and try to find handler */
	 /*  otherwise give up */
       {
	   int ret;
	   CMbuffer local = NULL;
 #ifdef EVER_HAVE_HANDLERS_OTHER_THAN_PBIO
	   if (cm_buffer == NULL) {
	       local = fill_cmbuffer(cm, buffer, length);
	       buffer = local->buffer;
	   }
 #endif
	   CManager_unlock(cm);
	   switch (*(int*)buffer) {
	   case 0x5042494f:
	   case 0x4f494250:  /* incoming FFS format protocol message */
	     {
	       extern int CM_pbio_query(CMConnection conn, CMTransport trans,
					char *buffer, size_t length);
	       
	       size_t ret = CM_pbio_query(conn, conn->trans, buffer, length);
	       CManager_lock(cm);
	       return ret;
	     }
	   }
	   ret = CMdo_non_CM_handler(conn, *(int*)buffer, buffer, length);
	   CManager_lock(cm);
	   if (local) cm_return_data_buf(cm, local);
	   if (ret == -1) {
	       printf("Unknown message on connection %p, failed %d, closed %d, %x\n", conn, conn->failed, conn->closed, *(int*)buffer);
	       CMtrace_out(conn->cm, CMFreeVerbose, "Calling connection unknown message failed with dereference %p\n", conn);
	       INT_CMConnection_failed(conn);
	   }
	   return 0;
       }
     }

     if (get_attrs == 1) {
	 if (!event_msg) {
	     header_len = 16;/* magic plus two 4-byte sizes (attrs + data) */
	     skip = 4;
	 } else {
	     header_len = 16;
	 }
	 if (!short_length) {
	     header_len = 16; /* extra data length bytes */
	     skip = 0;
	 }
     } else {
	 if (short_length) {
	     header_len = 8; /* magic plus 4-byte size */
	 } else {
	     header_len = 12; /* magic plus 8-byte size */
	 }
     }

     if (length < header_len) {
	 return header_len - length;
     }
     base = buffer + 4 + skip; /* skip used data */
     if (short_length) {
	 if (byte_swap) {
	     int tmp;
 #ifdef WORDS_BIGENDIAN	    
	     checksum = (unsigned char) check_sum_base[0];
 #else
	     checksum = (unsigned char) check_sum_base[3];
 #endif
	     ((char*)&tmp)[0] = base[3];
	     ((char*)&tmp)[1] = base[2];
	     ((char*)&tmp)[2] = base[1];
	     ((char*)&tmp)[3] = base[0];
	     data_length = tmp;
	     if (header_len != 8) {
		 ((char*)&attr_length)[0] = base[7];
		 ((char*)&attr_length)[1] = base[6];
		 ((char*)&attr_length)[2] = base[5];
		 ((char*)&attr_length)[3] = base[4];
	     }
	 } else {
 #ifdef WORDS_BIGENDIAN	    
	     checksum = (unsigned char) check_sum_base[3];
 #else
	     checksum = (unsigned char) check_sum_base[0];
 #endif
	     data_length = ((int *) base)[0];
	     if (header_len != 8) {
		 attr_length = ((int *) base)[1];
	     }
	 }
     } else {
	 if (byte_swap) {
 #ifdef WORDS_BIGENDIAN	    
	     checksum = (unsigned char) check_sum_base[0];
 #else
	     checksum = (unsigned char) check_sum_base[3];
 #endif
	     int tmp;
	     ((char*)&tmp)[0] = base[3];
	     ((char*)&tmp)[1] = base[2];
	     ((char*)&tmp)[2] = base[1];
	     ((char*)&tmp)[3] = base[0];
	     data_length = ((int64_t)tmp) << 32;
	     ((char*)&tmp)[0] = base[7];
	     ((char*)&tmp)[1] = base[6];
	     ((char*)&tmp)[2] = base[5];
	     ((char*)&tmp)[3] = base[4];
	     data_length += tmp;
	     if (header_len != 12) {
		 ((char*)&attr_length)[0] = base[11];
		 ((char*)&attr_length)[1] = base[10];
		 ((char*)&attr_length)[2] = base[9];
		 ((char*)&attr_length)[3] = base[8];
	     }
	 } else {
 #ifdef WORDS_BIGENDIAN	    
	     checksum = (unsigned char) check_sum_base[3];
 #else
	     checksum = (unsigned char) check_sum_base[0];
 #endif
	     data_length = ((int64_t)(((unsigned int *) base)[1])) << 32;
	     data_length += ((unsigned int *) base)[0];
	     if (header_len != 12) {
		 attr_length = ((int *) base)[2];
	     }
	 }
     }
     if (performance_msg || evcontrol_msg) {
	 performance_func = 0xff & (data_length >> 56);
	 data_length &= 0xffffffffffffff;
	 data_length -= 12;  /* subtract off header size */
     }
     if (handshake) {
	 handshake_version = 0xff & (data_length >> 24);
	 data_length &= 0xffffff;
	 data_length -= 8;  /* subtract off header size */
     }
     if (event_msg) {
	 char *stone_base = base;
	 if (header_len == 16) {
	     if (byte_swap) {
		 ((char*)&stone_id)[0] = stone_base[11];
		 ((char*)&stone_id)[1] = stone_base[10];
		 ((char*)&stone_id)[2] = stone_base[9];
		 ((char*)&stone_id)[3] = stone_base[8];
	     } else {
		 stone_id = ((int *) stone_base)[2];
	     }
	 } else if (header_len == 20) {
	     if (byte_swap) {
		 ((char*)&stone_id)[0] = stone_base[15];
		 ((char*)&stone_id)[1] = stone_base[14];
		 ((char*)&stone_id)[2] = stone_base[13];
		 ((char*)&stone_id)[3] = stone_base[12];
	     } else {
		 stone_id = ((int *) stone_base)[3];
	     }
	 }
     }

     if ((ssize_t)length < header_len + data_length + attr_length) {
	 return header_len + data_length + attr_length - 
	     length;
     }
     /* At this point, the message is accepted.  Determine processing */
     base = buffer + header_len;
     if (handshake) {
	 CMdo_handshake(conn, handshake_version, byte_swap, base);
	 return 0;
     }
     if (checksum != 0) {
	 unsigned char calculated_checksum = 0;
	 for (i=4; i < length; i++) {
	     calculated_checksum += ((unsigned char *)buffer)[i];
	 }
	 if (calculated_checksum != checksum) {
	     printf("Discarding incoming message because of corruption.  Checksum mismatch got %x, expected %x\n",
		    calculated_checksum, checksum);
	     printf("Message was : ");
	     for (i=0 ; i < length; i++) {
		 printf(" %02x",  ((unsigned char *)buffer)[i]);
	     }
	     printf("\n");
	     return 0;
	 }
     }
     if (performance_msg) {
	 CMdo_performance_response(conn, data_length, performance_func, byte_swap,
				   base);
	 return 0;
     } else if (evcontrol_msg) {
	 int arg;
	 if (byte_swap) {
	     ((char*)&arg)[0] = base[3];
	     ((char*)&arg)[1] = base[2];
	     ((char*)&arg)[2] = base[1];
	     ((char*)&arg)[3] = base[0];
	 } else {
	     arg = ((int *) base)[0];
	 }
 #ifdef EV_INTERNAL_H
	 INT_EVhandle_control_message(conn->cm, conn, (unsigned char) performance_func, arg);
 #endif
	 return 0;
     }
     data_buffer = base + attr_length;
     if (attr_length != 0) {
	 attrs = CMdecode_attr_from_xmit(conn->cm, base);
	 if (CMtrace_on(conn->cm, CMDataVerbose)) {
	     fprintf(cm->CMTrace_file, "CM - Incoming read attributes -> ");
	     fdump_attr_list(cm->CMTrace_file, attrs);
	 }
     }
     if (event_msg) {
	 CMbuffer local = NULL;
	 CMtrace_out(cm, CMDataVerbose, "CM - Receiving event message data len %"  PRId64 ", attr len %d, stone_id %x\n",
		     data_length, attr_length, stone_id);
	 if (attrs == NULL){
	     attrs = CMcreate_attr_list(cm);
	 }
	 set_int_attr(attrs, CM_EVENT_SIZE, (int)data_length);
	 set_long_attr(attrs, CM_INCOMING_CONNECTION, (intptr_t)conn);

	 if (cm_buffer == NULL) {
	     local = fill_cmbuffer(cm, buffer, length);
	     data_buffer = (data_buffer - buffer) + (char*)local->buffer;
	     buffer = local->buffer;
	     cm_buffer = local;
	 }
 #ifdef EV_INTERNAL_H	
	 internal_cm_network_submit(cm, cm_buffer, attrs, conn, data_buffer,
				    data_length, stone_id);
 #endif
	 if (local) cm_return_data_buf(cm, local);
	 free_attr_list(attrs);
	 return 0;
     }
     {
	 FMFormat format = FMformat_from_ID(FMContext_from_FFS(cm->FFScontext), data_buffer);
	 char *incoming_name;
	 if (format == NULL) {
	     printf("BAD INCOMING DATA\n");
	     return 0;
	 }
	 incoming_name = name_of_FMformat(format);

	 for (i = 0; i < cm->reg_format_count; i++) {
	     if ((cm->reg_formats[i]->registration_pending) && 
		 (strcmp(incoming_name, cm->reg_formats[i]->format_name) == 0)) {
		 CMcomplete_format_registration(cm->reg_formats[i], 0);
	     }
	 }
     }
     local_format = FFS_target_from_encode(conn->cm->FFScontext, data_buffer);
     original_format = FFSTypeHandle_from_encode(conn->cm->FFScontext, data_buffer);
     if (local_format == NULL) {
	 if (conn->cm->unregistered_format_handler) {
	     conn->cm->unregistered_format_handler(conn, name_of_FMformat(FMFormat_of_original(original_format)));
	 } else {
	     fprintf(stderr, "No conversion found for incoming CM message\n");
	 }
	 return 0;
     }
     CMtrace_out(cm, CMDataVerbose, "CM - Receiving record of type %s, FFSformat %p\n", 
		 name_of_FMformat(FMFormat_of_original(original_format)), original_format);
     for (i=0; i< cm->in_format_count; i++) {
	 if (cm->in_formats[i].format == local_format) {
	     cm_format = &cm->in_formats[i];
	     CMtrace_out(cm, CMDataVerbose, "CM - Found incoming cm_format %p, matching FFSformat %p\n", 
			 cm_format, local_format);
	 }
     }
     if (cm_format == NULL) {
	 cm_format = CMidentify_rollbackCMformat(cm, data_buffer);
	 CMtrace_out(cm, CMDataVerbose, "CM - Created cm_format %p, matching FFSformat %p\n", 
		     cm_format, original_format);
	 if(cm_format) {
	     CMtrace_out(cm, CMDataVerbose, "CM - Calling CMcreate_conversion type %s, format %p\n", 
			 name_of_FMformat(FMFormat_of_original(original_format)), original_format);
	     CMcreate_conversion(cm, cm_format);
	     CMtrace_out(cm, CMDataVerbose, "CM - after CMcreate_conversion format %p, has_conversion is %d\n", 
			 original_format, FFShas_conversion(original_format));
	 }
     }

     if ((cm_format == NULL) || (cm_format->handler == NULL)) {
	 fprintf(stderr, "CM - No handler for incoming data of this version of format \"%s\"\n",
		 name_of_FMformat(FMFormat_of_original(original_format)));
	 return 0;
     } else if (!FFShas_conversion(original_format)) {
	 CMcreate_conversion(cm, cm_format);
     }
     assert(FFShas_conversion(original_format));

     if (FFSdecode_in_place_possible(original_format)) {
	 if (!FFSdecode_in_place(cm->FFScontext, data_buffer, 
					(void**) (intptr_t) &decode_buffer)) {
	     printf("Decode failed\n");
	     return 0;
	 }
     } else {
	 decoded_length = FFS_est_decode_length(cm->FFScontext, data_buffer, data_length);
	 cm_decode_buf = cm_get_data_buf(cm, decoded_length);
	 decode_buffer = cm_decode_buf->buffer;
	 FFSdecode_to_buffer(cm->FFScontext, data_buffer, decode_buffer);
     }
     if(cm_format->older_format) {
 #ifdef EVOL
	 if(!process_old_format_data(cm, cm_format, &decode_buffer, &cm_decode_buf)){
	     return 0;
	 }
 #endif
     }
     if (CMtrace_on(conn->cm, CMDataVerbose)) {
	 static int dump_char_limit = 256;
	 static int warned = 0;
	 static int size_set = 0;
	 int r;
	 if (size_set == 0) {
	     char *size_str = getenv("CMDumpSize");
	     size_set++;
	     if (size_str != NULL) {
		 dump_char_limit = atoi(size_str);
	     }
	 }
	 fprintf(cm->CMTrace_file, "CM - record type %s, contents are:\n  ", name_of_FMformat(FMFormat_of_original(cm_format->format)));
	 r = FMfdump_data(cm->CMTrace_file, FMFormat_of_original(cm_format->format), decode_buffer, dump_char_limit);
	 if (!r && !warned) {
	     printf("\n\n  ****  Warning **** CM record dump truncated\n");
	     printf("  To change size limits, set CMDumpSize environment variable.\n");
	     warned++;
	 }
	 fprintf(cm->CMTrace_file, "\n=======\n");
     }
     if (attrs == NULL) {
	 attrs = CMcreate_attr_list(cm);
	 CMattr_merge_lists(cm, attrs, conn->attrs);
     } else {
	 CMattr_merge_lists(cm, attrs, conn->attrs);
     }

     /* 
      *  Handler may recurse, so clear these structures first
      */
     CMtrace_out(cm, CMFreeVerbose, "CM - add reference connection %p - handler\n", conn);
     INT_CMConnection_add_reference(conn);
     {
         CMHandlerFunc handler = cm_format->handler;
	 void *client_data = cm_format->client_data;
	 CMbuffer local = NULL;
	 if ((cm_buffer == NULL) && (decode_buffer == NULL)) {
	     local = fill_cmbuffer(cm, buffer, length);
	     buffer = local->buffer;
	 }
	 CManager_unlock(cm);
	 handler(cm, conn, decode_buffer, client_data, attrs);
	 CManager_lock(cm);
	 if (local) cm_return_data_buf(cm, local);
	 CMtrace_out(cm, CMFreeVerbose, "CM - delete reference connection %p - handler\n", conn);
	 INT_CMConnection_dereference(conn);
     }
     if (cm_decode_buf) {
	 cm_return_data_buf(cm, cm_decode_buf);
	 cm_decode_buf = NULL;
     }
     if (attrs) {
	 INT_CMfree_attr_list(cm, attrs);
	 attrs = NULL;
     }
     CMtrace_out(cm, CMDataVerbose, "CM - Finish processing - record of type %s\n", 
		 name_of_FMformat(FMFormat_of_original(original_format)));
     return 0;
 }